

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::Collect<(Memory::CollectionFlags)268439552>(Recycler *this)

{
  BOOL BVar1;
  
  if ((this->collectionState).value != CollectionStateNotCollecting) {
    BVar1 = TryFinishConcurrentCollect<(Memory::CollectionFlags)268439552>(this);
    return BVar1;
  }
  this->collectionWrapper->_isScriptContextCloseGCPending = 0;
  SetupPostCollectionFlags<(Memory::CollectionFlags)268439552>(this);
  this->hasIncompleteDoCollect = true;
  BVar1 = DoCollectWrapped(this,CollectConcurrentStress);
  return BVar1;
}

Assistant:

BOOL
Recycler::Collect()
{
#if ENABLE_CONCURRENT_GC
    if (this->CollectionInProgress())
    {
        // If we are forced in thread, we can't be concurrent
        // If we are not concurrent we should have been handled before in CollectInternal and we shouldn't be here
        Assert((flags & CollectOverride_ForceInThread) == 0);
        Assert((flags & CollectMode_Concurrent) != 0);
        return TryFinishConcurrentCollect<flags>();
    }
#endif

    // We clear the flag indicating that there is a GC pending because
    // of script context close, since we're about to do a GC anyway,
    // since the current GC will suffice.
    this->collectionWrapper->ClearIsScriptContextCloseGCPending();

    SetupPostCollectionFlags<flags>();

    const BOOL partial = GetPartialFlag<flags>();
    CollectionFlags finalFlags = flags;
    if (!partial)
    {
        finalFlags = (CollectionFlags)(flags & ~CollectMode_Partial);
    }

    // ExecuteRecyclerCollectionFunction may cause exception. In which case, we may trigger the assert
    // in SetupPostCollectionFlags because we didn't reset the inExhausitvECollection variable if
    // an exception. Use this flag to disable it the assertion if exception occur
    DebugOnly(this->hasIncompleteDoCollect = true);

    {
        RECORD_TIMESTAMP(initialCollectionStartTime);
#ifdef NTBUILD
        this->telemetryBlock->initialCollectionStartProcessUsedBytes = PageAllocator::GetProcessUsedBytes();
        this->telemetryBlock->exhaustiveRepeatedCount = 0;
#endif

        return DoCollectWrapped(finalFlags);
    }
}